

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O1

wchar_t adjust_dam(player *p,wchar_t type,wchar_t dam,_Bool actual)

{
  short sVar1;
  bool bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t extraout_EAX;
  uint32_t uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  
  iVar7 = 100;
  if ((p == (player *)0x0) || (p->race == (player_race *)0x0)) goto LAB_001c8aec;
  wVar4 = type + L'\xfffffff2';
  uVar6 = (ulong)(uint)wVar4;
  if ((uint)wVar4 < 9) {
    wVar4 = (&switchD_001c8897::switchdataD_00238cf8)[uVar6] + L'\x00238cf8';
    switch(uVar6) {
    case 0:
      sVar1 = (p->state).el_info[3].res_level;
      if (actual) {
        equip_learn_element(p,L'\x03');
      }
      iVar7 = 100;
      if (sVar1 != 0) {
        wVar4 = (sVar1 * dam + 99) / 100;
        break;
      }
      bVar2 = false;
      wVar4 = L'\0';
      goto LAB_001c8ae3;
    default:
      goto switchD_001c8897_caseD_1;
    case 5:
      sVar1 = (p->state).el_info[2].res_level;
      if (actual) {
        equip_learn_element(p,L'\x02');
      }
      if (sVar1 == 0) {
        iVar7 = 0;
      }
      else {
        iVar7 = ((int)sVar1 * (dam / 2) + 99) / 100;
      }
      if (p->race == (player_race *)0x0) {
        iVar8 = 100;
      }
      else {
        iVar8 = (int)(p->state).el_info[1].res_level;
        if (actual) {
          equip_learn_element(p,L'\x01');
        }
      }
      if (iVar8 == 0) {
        iVar8 = 0;
      }
      else {
        iVar8 = (iVar8 * (dam / 2) + 99) / 100;
      }
      wVar4 = iVar8 + iVar7;
      break;
    case 6:
      wVar4 = dam / 2;
      break;
    case 7:
      sVar1 = (p->state).el_info[2].res_level;
      if (actual) {
        equip_learn_element(p,L'\x02');
      }
      if (sVar1 == 0) {
        iVar7 = 0;
      }
      else {
        iVar7 = ((int)sVar1 * (dam / 2) + 99) / 100;
      }
      wVar4 = adjust_dam(p,L'\x04',dam / 2,actual);
      wVar4 = wVar4 + iVar7;
      break;
    case 8:
      sVar1 = (p->state).el_info[2].res_level;
      if (actual) {
        equip_learn_element(p,L'\x02');
      }
      if (sVar1 == 0) {
        iVar7 = 0;
      }
      else {
        iVar7 = (((dam * 2) / 3) * (int)sVar1 + 99) / 100;
      }
      wVar4 = adjust_dam(p,L'\x06',dam / 3,actual);
      wVar4 = wVar4 + iVar7;
    }
    iVar7 = 100;
    bVar2 = false;
  }
  else {
switchD_001c8897_caseD_1:
    bVar2 = true;
    if ((type < L'\x1c') && (iVar7 = (int)(p->state).el_info[type].res_level, wVar4 = type, actual))
    {
      equip_learn_element(p,type);
      wVar4 = extraout_EAX;
    }
  }
LAB_001c8ae3:
  if (!bVar2) {
    return wVar4;
  }
LAB_001c8aec:
  if (iVar7 == 0) {
    wVar4 = L'\0';
  }
  else {
    if ((type == L'\0' && p != (player *)0x0) && (_Var3 = minus_ac(p), _Var3)) {
      dam = (dam - (dam + L'\x01' >> 0x1f)) + 1 >> 1;
    }
    if ((L'\x03' < type) && (iVar7 < 0x65)) {
      iVar8 = 100 - iVar7;
      if (iVar7 < 0x33) {
        iVar8 = iVar7;
      }
      iVar8 = (iVar8 << (type == L'\v')) / 10;
      uVar5 = Rand_div(iVar8 * 2 + 1);
      iVar7 = (iVar7 - iVar8) + uVar5;
    }
    wVar4 = (iVar7 * dam + 99) / 100;
  }
  return wVar4;
}

Assistant:

int adjust_dam(struct player *p, int type, int dam, bool actual)
{
	int dam_percent = 100;

	/* If an actual player exists, get their actual resist */
	if (p && p->race) {
		int special_dam = 0;

		/* Handle special cases */
		if (type == PROJ_ICE) {
			return adjust_dam(p, PROJ_COLD, dam, actual);
		} else if (type == PROJ_PLASMA) {
			special_dam = adjust_dam(p, PROJ_FIRE, dam / 2, actual);
			special_dam += adjust_dam(p, PROJ_ELEC, dam / 2, actual);
			return special_dam;
		} else if (type == PROJ_STORM) {
			/* Extra storm damage will come later */
			return dam / 2;
		} else if (type == PROJ_DRAGONFIRE) {
			special_dam = adjust_dam(p, PROJ_FIRE, dam / 2, actual);
			special_dam += adjust_dam(p, PROJ_POIS, dam / 2, actual);
			return special_dam;
		} else if (type == PROJ_HELLFIRE) {
			special_dam = adjust_dam(p, PROJ_FIRE, 2 * dam / 3, actual);
			special_dam += adjust_dam(p, PROJ_DARK, dam / 3, actual);
			return special_dam;
		} else if (type < ELEM_MAX) {
			/* For the regular elements, the stored resistance level is the
			 * percentage of damage taken */
			dam_percent = p->state.el_info[type].res_level;

			/* Notice element stuff */
			if (actual) {
				equip_learn_element(p, type);
			}
		}
	}

	/* Immune */
	if (dam_percent == RES_LEVEL_MAX) return 0;

	/* Acid damage is halved by armour */
	if (type == PROJ_ACID && p && minus_ac(p)) {
		dam = (dam + 1) / 2;
	}

	/* High resists get randomised, especially chaos */
	if ((type >= ELEM_HIGH_MIN) && (dam_percent <= RES_LEVEL_BASE)) {
		/* How far is the closer of zero and 100 */
		int max_range =	dam_percent > 50 ? 100 - dam_percent : dam_percent;

		/* Random range is 1 or 2 times 10% of that range */
		int range = (((type == PROJ_CHAOS) ? 2 : 1) * max_range) / 10;

		/* Randomize */
		dam_percent = dam_percent - range + randint0((2 * range) + 1);
	}

	/* Apply the percentage resistance, rounded up */
	return ((dam * dam_percent) + 99) / 100;
}